

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O0

Offset<reflection::RPCCall> __thiscall reflection::RPCCallBuilder::Finish(RPCCallBuilder *this)

{
  uoffset_t _o;
  uoffset_t end;
  RPCCallBuilder *this_local;
  Offset<reflection::RPCCall> o;
  
  _o = flatbuffers::FlatBufferBuilderImpl<false>::EndTable(this->fbb_,this->start_);
  flatbuffers::Offset<reflection::RPCCall>::Offset
            ((Offset<reflection::RPCCall> *)((long)&this_local + 4),_o);
  flatbuffers::FlatBufferBuilderImpl<false>::Required<reflection::RPCCall>
            (this->fbb_,this_local._4_4_,4);
  flatbuffers::FlatBufferBuilderImpl<false>::Required<reflection::RPCCall>
            (this->fbb_,this_local._4_4_,6);
  flatbuffers::FlatBufferBuilderImpl<false>::Required<reflection::RPCCall>
            (this->fbb_,this_local._4_4_,8);
  return (Offset<reflection::RPCCall>)this_local._4_4_;
}

Assistant:

::flatbuffers::Offset<RPCCall> Finish() {
    const auto end = fbb_.EndTable(start_);
    auto o = ::flatbuffers::Offset<RPCCall>(end);
    fbb_.Required(o, RPCCall::VT_NAME);
    fbb_.Required(o, RPCCall::VT_REQUEST);
    fbb_.Required(o, RPCCall::VT_RESPONSE);
    return o;
  }